

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O0

bool ReadDFI(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  ulong extraout_RAX;
  ulong uVar4;
  exception *peVar5;
  element_type *peVar6;
  size_t in_RCX;
  FILE *__stream;
  allocator<unsigned_char> local_79;
  undefined1 local_78 [8];
  Data track_data;
  uint32_t data_length;
  CylHead cylhead;
  undefined1 auStack_4c [2];
  DFI_TRACK_HEADER th;
  shared_ptr<DFIDisk> dfi_disk;
  int local_24;
  shared_ptr<Disk> *psStack_20;
  DFI_FILE_HEADER fh;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  __stream = (FILE *)0x0;
  psStack_20 = disk;
  memset(&local_24,0,4);
  MemFile::rewind(file,__stream);
  if (((extraout_RAX & 1) == 0) ||
     (uVar4 = MemFile::read(file,(int)&local_24,(void *)0x4,in_RCX), (uVar4 & 1) == 0)) {
    file_local._7_1_ = false;
  }
  else {
    if (local_24 == 0x52454644) {
      peVar5 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[46]>
                (peVar5,(char (*) [46])"old-style DiscFerret images are not supported");
      __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
    }
    if (local_24 == 0x32454644) {
      std::make_shared<DFIDisk>();
      while (uVar4 = MemFile::read(file,(int)&cylhead + 2,(void *)0xa,in_RCX), (uVar4 & 1) != 0) {
        uVar2 = util::betoh<unsigned_short>(cylhead.head._2_2_);
        if (uVar2 != 1) {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[39]>
                    (peVar5,(char (*) [39])"hard-sectored images are not supported");
          __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
        }
        uVar2 = util::betoh<unsigned_short>(cylhead.cyl._2_2_);
        uVar3 = util::betoh<unsigned_short>((unsigned_short)cylhead.head);
        CylHead::CylHead((CylHead *)
                         ((long)&track_data.
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4),(uint)uVar2,
                         (uint)uVar3);
        track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             _auStack_4c >> 0x18 | (_auStack_4c & 0xff0000) >> 8 | (_auStack_4c & 0xff00) << 8 |
             _auStack_4c << 0x18;
        uVar4 = (ulong)(uint)track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::allocator<unsigned_char>::allocator(&local_79);
        Data::vector((Data *)local_78,uVar4,&local_79);
        std::allocator<unsigned_char>::~allocator(&local_79);
        bVar1 = MemFile::read<Data>(file,(Data *)local_78);
        if (!bVar1) {
          peVar5 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[6]>
                    (peVar5,(char (*) [20])"short file reading ",
                     (CylHead *)
                     ((long)&track_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     (char (*) [6])0x2ae14e);
          __cxa_throw(peVar5,&util::exception::typeinfo,util::exception::~exception);
        }
        peVar6 = std::__shared_ptr_access<DFIDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<DFIDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&th.head);
        DFIDisk::add_track_data
                  (peVar6,(CylHead *)
                          ((long)&track_data.
                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   (Data *)local_78);
        Data::~Data((Data *)local_78);
      }
      peVar6 = std::__shared_ptr_access<DFIDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<DFIDisk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &th.head);
      std::__cxx11::string::operator=
                ((string *)&(peVar6->super_DemandDisk).super_Disk.strType,"DFI");
      std::shared_ptr<Disk>::operator=(psStack_20,(shared_ptr<DFIDisk> *)&th.head);
      file_local._7_1_ = true;
      std::shared_ptr<DFIDisk>::~shared_ptr((shared_ptr<DFIDisk> *)&th.head);
    }
    else {
      file_local._7_1_ = false;
    }
  }
  return file_local._7_1_;
}

Assistant:

bool ReadDFI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DFI_FILE_HEADER fh{};

    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;

    if (!memcmp(fh.signature, "DFER", sizeof(fh.signature)))
        throw util::exception("old-style DiscFerret images are not supported");
    else if (memcmp(fh.signature, "DFE2", sizeof(fh.signature)))
        return false;

    auto dfi_disk = std::make_shared<DFIDisk>();

    for (;;)
    {
        DFI_TRACK_HEADER th;
        if (!file.read(&th, sizeof(th)))
            break;

        if (util::betoh(th.sector) != 1)
            throw util::exception("hard-sectored images are not supported");

        CylHead cylhead(util::betoh(th.cyl), util::betoh(th.head));
        auto data_length = (static_cast<uint32_t>(th.datalen[0]) << 24) | (th.datalen[1] << 16) | (th.datalen[2] << 8) | th.datalen[3];

        Data track_data(data_length);
        if (!file.read(track_data))
            throw util::exception("short file reading ", cylhead, " data");

        dfi_disk->add_track_data(cylhead, std::move(track_data));
    }

    dfi_disk->strType = "DFI";
    disk = dfi_disk;

    return true;
}